

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::CodeHolder::copyFlattenedData
          (CodeHolder *this,void *dst,size_t dstSize,CopySectionFlags copyFlags)

{
  bool bVar1;
  Error EVar2;
  CopySectionFlags in_ECX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  size_t paddingSize;
  uint8_t *dstTarget;
  size_t offset;
  size_t bufferSize;
  Section *section;
  iterator __end2;
  iterator __begin2;
  ZoneVector<asmjit::v1_14::Section_*> *__range2;
  size_t end;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  size_t local_f0;
  void *local_e8;
  long local_e0;
  ulong local_d8;
  long local_d0;
  long *local_c8;
  long *local_c0;
  long *local_b8;
  ulong local_b0;
  CopySectionFlags local_a4;
  ulong local_a0;
  long local_98;
  long *local_80;
  long *local_78;
  long *local_70;
  long *local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  undefined8 *local_28;
  ulong *local_20;
  ulong *local_18;
  ulong *local_10;
  ulong *local_8;
  
  local_b0 = 0;
  local_b8 = (long *)(in_RDI + 0xe8);
  local_c0 = (long *)*local_b8;
  local_c8 = (long *)(*local_b8 + (ulong)*(uint *)(in_RDI + 0xf0) * 8);
  local_a4 = in_ECX;
  local_a0 = in_RDX;
  local_98 = in_RSI;
  local_80 = local_b8;
  local_78 = local_b8;
  local_70 = local_b8;
  local_68 = local_b8;
  while( true ) {
    if (local_c0 == local_c8) {
      if ((local_b0 < local_a0) &&
         (bVar1 = Support::test<asmjit::v1_14::CopySectionFlags,asmjit::v1_14::CopySectionFlags>
                            (local_a4,kPadTargetBuffer), bVar1)) {
        memset((void *)(local_98 + local_b0),0,local_a0 - local_b0);
      }
      return 0;
    }
    local_d0 = *local_c0;
    local_58 = local_d0;
    if (local_a0 < *(ulong *)(local_d0 + 0x10)) break;
    local_38 = local_d0 + 0x48;
    local_d8 = *(ulong *)(local_d0 + 0x50);
    local_e0 = *(long *)(local_d0 + 0x10);
    local_60 = local_d0;
    local_40 = local_d0;
    if (local_a0 - local_e0 < local_d8) {
      EVar2 = DebugUtils::errored(2);
      return EVar2;
    }
    local_e8 = (void *)(local_98 + local_e0);
    local_f0 = 0;
    local_28 = (undefined8 *)(local_d0 + 0x48);
    local_30 = local_d0;
    memcpy(local_e8,(void *)*local_28,local_d8);
    bVar1 = Support::test<asmjit::v1_14::CopySectionFlags,asmjit::v1_14::CopySectionFlags>
                      (local_a4,kPadSectionBuffer);
    if ((bVar1) && (local_48 = local_d0, local_d8 < *(ulong *)(local_d0 + 0x18))) {
      local_f8 = local_a0 - local_e0;
      local_50 = local_d0;
      local_100 = *(ulong *)(local_d0 + 0x18);
      local_18 = &local_f8;
      local_20 = &local_100;
      local_110 = local_f8;
      if (local_100 < local_f8) {
        local_110 = local_100;
      }
      local_f0 = local_110 - local_d8;
      memset((void *)((long)local_e8 + local_d8),0,local_f0);
    }
    local_108 = local_e0 + local_d8 + local_f0;
    local_8 = &local_b0;
    local_10 = &local_108;
    local_118 = local_108;
    if (local_108 <= local_b0) {
      local_118 = local_b0;
    }
    local_b0 = local_118;
    local_c0 = local_c0 + 1;
  }
  EVar2 = DebugUtils::errored(2);
  return EVar2;
}

Assistant:

Error CodeHolder::copyFlattenedData(void* dst, size_t dstSize, CopySectionFlags copyFlags) noexcept {
  size_t end = 0;
  for (Section* section : _sectionsByOrder) {
    if (section->offset() > dstSize)
      return DebugUtils::errored(kErrorInvalidArgument);

    size_t bufferSize = section->bufferSize();
    size_t offset = size_t(section->offset());

    if (ASMJIT_UNLIKELY(dstSize - offset < bufferSize))
      return DebugUtils::errored(kErrorInvalidArgument);

    uint8_t* dstTarget = static_cast<uint8_t*>(dst) + offset;
    size_t paddingSize = 0;
    memcpy(dstTarget, section->data(), bufferSize);

    if (Support::test(copyFlags, CopySectionFlags::kPadSectionBuffer) && bufferSize < section->virtualSize()) {
      paddingSize = Support::min<size_t>(dstSize - offset, size_t(section->virtualSize())) - bufferSize;
      memset(dstTarget + bufferSize, 0, paddingSize);
    }

    end = Support::max(end, offset + bufferSize + paddingSize);
  }

  if (end < dstSize && Support::test(copyFlags, CopySectionFlags::kPadTargetBuffer)) {
    memset(static_cast<uint8_t*>(dst) + end, 0, dstSize - end);
  }

  return kErrorOk;
}